

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

double __thiscall despot::Logger::StderrUndiscountedRoundReward(Logger *this)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  double local_50;
  int n;
  double reward;
  double dStack_20;
  int i;
  double sum2;
  double sum;
  Logger *this_local;
  
  sum2 = 0.0;
  dStack_20 = 0.0;
  reward._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&this->undiscounted_round_rewards_);
    if (sVar3 <= (ulong)(long)reward._4_4_) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->undiscounted_round_rewards_,(long)reward._4_4_);
    dVar1 = *pvVar4;
    sum2 = dVar1 + sum2;
    dStack_20 = dVar1 * dVar1 + dStack_20;
    reward._4_4_ = reward._4_4_ + 1;
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&this->undiscounted_round_rewards_);
  iVar2 = (int)sVar3;
  if (iVar2 < 1) {
    local_50 = 0.0;
  }
  else {
    local_50 = sqrt((dStack_20 / (double)iVar2) / (double)iVar2 -
                    (((sum2 * sum2) / (double)iVar2) / (double)iVar2) / (double)iVar2);
  }
  return local_50;
}

Assistant:

double Logger::StderrUndiscountedRoundReward() const {
	double sum = 0, sum2 = 0;
	for (int i = 0; i < undiscounted_round_rewards_.size(); i++) {
		double reward = undiscounted_round_rewards_[i];
		sum += reward;
		sum2 += reward * reward;
	}
	int n = undiscounted_round_rewards_.size();
	return n > 0 ? sqrt(sum2 / n / n - sum * sum / n / n / n) : 0.0;
}